

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

QDomNodePrivate * __thiscall
QDomDocumentTypePrivate::replaceChild
          (QDomDocumentTypePrivate *this,QDomNodePrivate *newChild,QDomNodePrivate *oldChild)

{
  bool bVar1;
  QMultiHash<QString,_QDomNodePrivate_*> *this_00;
  QString *key;
  QDomNodePrivate **value;
  long in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  QDomNodePrivate *p;
  QDomNodePrivate *in_stack_ffffffffffffff18;
  QDomNodePrivate **in_stack_ffffffffffffff20;
  QDomNodePrivate *in_stack_ffffffffffffff28;
  QDomNodePrivate *in_stack_ffffffffffffff30;
  QDomNodePrivate *in_stack_ffffffffffffff38;
  char local_40 [24];
  char local_28 [24];
  QDomNodePrivate *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = QDomNodePrivate::replaceChild
                       (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                        in_stack_ffffffffffffff28);
  if (local_10 != (QDomNodePrivate *)0x0) {
    if ((in_RDX == 0) || (bVar1 = QDomNodePrivate::isEntity((QDomNodePrivate *)0x11395d), !bVar1)) {
      if ((in_RDX != 0) && (bVar1 = QDomNodePrivate::isNotation((QDomNodePrivate *)0x1139bd), bVar1)
         ) {
        in_stack_ffffffffffffff30 = (QDomNodePrivate *)(*(long *)(in_RDI + 0xb0) + 8);
        QDomNodePrivate::nodeName(in_stack_ffffffffffffff18);
        QMultiHash<QString,_QDomNodePrivate_*>::remove
                  ((QMultiHash<QString,_QDomNodePrivate_*> *)in_stack_ffffffffffffff30,local_40);
        QString::~QString((QString *)0x113a09);
      }
    }
    else {
      this_00 = (QMultiHash<QString,_QDomNodePrivate_*> *)(*(long *)(in_RDI + 0xa8) + 8);
      QDomNodePrivate::nodeName(in_stack_ffffffffffffff18);
      QMultiHash<QString,_QDomNodePrivate_*>::remove(this_00,local_28);
      QString::~QString((QString *)0x1139a9);
    }
    bVar1 = QDomNodePrivate::isEntity((QDomNodePrivate *)0x113a18);
    if (bVar1) {
      key = (QString *)(*(long *)(in_RDI + 0xa8) + 8);
      QDomNodePrivate::nodeName(in_stack_ffffffffffffff18);
      QMultiHash<QString,_QDomNodePrivate_*>::insert
                ((QMultiHash<QString,_QDomNodePrivate_*> *)in_stack_ffffffffffffff30,key,
                 in_stack_ffffffffffffff20);
      QString::~QString((QString *)0x113a74);
    }
    else {
      bVar1 = QDomNodePrivate::isNotation((QDomNodePrivate *)0x113a83);
      if (bVar1) {
        value = (QDomNodePrivate **)(*(long *)(in_RDI + 0xb0) + 8);
        QDomNodePrivate::nodeName(in_stack_ffffffffffffff18);
        QMultiHash<QString,_QDomNodePrivate_*>::insert
                  ((QMultiHash<QString,_QDomNodePrivate_*> *)in_stack_ffffffffffffff30,
                   (QString *)in_stack_ffffffffffffff28,value);
        QString::~QString((QString *)0x113ad6);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QDomNodePrivate* QDomDocumentTypePrivate::replaceChild(QDomNodePrivate* newChild, QDomNodePrivate* oldChild)
{
    // Call the original implementation
    QDomNodePrivate* p = QDomNodePrivate::replaceChild(newChild, oldChild);
    // Update the maps
    if (p) {
        if (oldChild && oldChild->isEntity())
            entities->map.remove(oldChild->nodeName());
        else if (oldChild && oldChild->isNotation())
            notations->map.remove(oldChild->nodeName());

        if (p->isEntity())
            entities->map.insert(p->nodeName(), p);
        else if (p->isNotation())
            notations->map.insert(p->nodeName(), p);
    }

    return p;
}